

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseVar(WastParser *this,Var *out_var)

{
  Location loc;
  string_view name;
  TokenType TVar1;
  Result RVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  long *plVar3;
  long lVar4;
  uint64_t index;
  Token token;
  uint64_t local_b0;
  Token local_a8;
  undefined1 local_68 [32];
  long *local_48 [2];
  long local_38 [2];
  undefined1 local_28 [8];
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_Literal) {
    Consume(&local_a8,this);
    if (2 < local_a8.token_type_ - First_Literal) {
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,0x72,"const Literal &wabt::Token::literal() const");
    }
    local_b0 = 0xffffffff;
    RVar2 = ParseUint64(local_a8.field_2.literal_.text._M_str,
                        local_a8.field_2.literal_.text._M_str + (long)local_a8.field_2.text_._M_str,
                        &local_b0);
    if (RVar2.enum_ == Error) {
      loc.filename._M_str._0_4_ = local_a8.loc.filename._M_str._0_4_;
      loc.filename._M_len = local_a8.loc.filename._M_len;
      loc.filename._M_str._4_4_ = local_a8.loc.filename._M_str._4_4_;
      loc.field_1.field_0.line = local_a8.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_a8.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_a8.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_a8.loc.field_1._12_4_;
      Error(this,loc,"invalid int \"%.*s\"",local_a8.field_2.literal_.text._M_len & 0xffffffff,
            local_a8.field_2.literal_.text._M_str,in_R8,in_R9);
    }
    Var::Var((Var *)local_68,(Index)local_b0,&local_a8.loc);
  }
  else {
    TVar1 = Peek(this,0);
    if (TVar1 != Last_String) {
      local_68._0_8_ = local_68 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a numeric index","");
      plVar3 = local_38;
      local_48[0] = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"a name","");
      local_a8.loc.filename._M_len = 0;
      local_a8.loc.filename._M_str = (char *)0x0;
      local_a8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 (string *)local_68,local_28);
      RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_a8,"12 or $foo");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      lVar4 = -0x40;
      do {
        if (plVar3 != (long *)plVar3[-2]) {
          operator_delete((long *)plVar3[-2],*plVar3 + 1);
        }
        plVar3 = plVar3 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      return (Result)RVar2.enum_;
    }
    Consume(&local_a8,this);
    if (5 < local_a8.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,99,"std::string_view wabt::Token::text() const");
    }
    name._M_str = local_a8.field_2.text_._M_str;
    name._M_len = local_a8.field_2.text_._M_len;
    Var::Var((Var *)local_68,name,&local_a8.loc);
  }
  Var::operator=(out_var,(Var *)local_68);
  Var::~Var((Var *)local_68);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseVar(Var* out_var) {
  WABT_TRACE(ParseVar);
  if (PeekMatch(TokenType::Nat)) {
    Token token = Consume();
    std::string_view sv = token.literal().text;
    uint64_t index = kInvalidIndex;
    if (Failed(ParseUint64(sv, &index))) {
      // Print an error, but don't fail parsing.
      Error(token.loc, "invalid int \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    *out_var = Var(index, token.loc);
    return Result::Ok;
  } else if (PeekMatch(TokenType::Var)) {
    Token token = Consume();
    *out_var = Var(token.text(), token.loc);
    return Result::Ok;
  } else {
    return ErrorExpected({"a numeric index", "a name"}, "12 or $foo");
  }
}